

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall tf::AnchorGuard::AnchorGuard(AnchorGuard *this,Node *node)

{
  uint uVar1;
  atomic<int> *paVar2;
  bool bVar3;
  uint local_3c;
  Node *node_local;
  AnchorGuard *this_local;
  
  this->_node = node;
  paVar2 = &this->_node->_estate;
  local_3c = (paVar2->super___atomic_base<int>)._M_i;
  do {
    LOCK();
    uVar1 = (paVar2->super___atomic_base<int>)._M_i;
    bVar3 = local_3c == uVar1;
    if (bVar3) {
      (paVar2->super___atomic_base<int>)._M_i = local_3c | 0x40000000;
      uVar1 = local_3c;
    }
    UNLOCK();
    local_3c = uVar1;
  } while (!bVar3);
  return;
}

Assistant:

AnchorGuard(Node* node) : _node{node} { 
    _node->_estate.fetch_or(ESTATE::ANCHORED, std::memory_order_relaxed);
  }